

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction_job.h
# Opt level: O0

void __thiscall
r_exec::ReductionJob<r_exec::CTPX>::ReductionJob
          (ReductionJob<r_exec::CTPX> *this,View *input,CTPX *processor)

{
  CTPX *processor_local;
  View *input_local;
  ReductionJob<r_exec::CTPX> *this_local;
  
  _ReductionJob::_ReductionJob(&this->super__ReductionJob);
  (this->super__ReductionJob).super__Object._vptr__Object =
       (_func_int **)&PTR__ReductionJob_002ece10;
  core::P<r_exec::View>::P(&this->input,input);
  core::P<r_exec::CTPX>::P(&this->processor,processor);
  return;
}

Assistant:

ReductionJob(View *input, _P *processor): _ReductionJob(), input(input), processor(processor) {}